

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_dbp_decoder.hpp
# Opt level: O2

void __thiscall duckdb::DbpDecoder::Skip<int>(DbpDecoder *this,idx_t skip_count)

{
  ulong uVar1;
  runtime_error *this_00;
  
  uVar1 = this->read_values + skip_count;
  if (uVar1 <= this->total_value_count) {
    this->read_values = uVar1;
    GetBatchInternal<int,true>(this,(data_ptr_t)0x0,skip_count);
    return;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  ::std::runtime_error::runtime_error(this_00,"DBP decode did not find enough values");
  __cxa_throw(this_00,&::std::runtime_error::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

void Skip(idx_t skip_count) {
		if (read_values + skip_count > total_value_count) {
			throw std::runtime_error("DBP decode did not find enough values");
		}
		read_values += skip_count;
		GetBatchInternal<T, true>(nullptr, skip_count);
	}